

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O0

int __thiscall
HashSet<TestHashSetDestructor>::remove(HashSet<TestHashSetDestructor> *this,char *__filename)

{
  Item *this_00;
  Item *pIVar1;
  Item *pIVar2;
  Item *item;
  Iterator *it_local;
  HashSet<TestHashSetDestructor> *this_local;
  
  this_00 = *(Item **)__filename;
  pIVar1 = this_00->nextCell;
  *this_00->cell = pIVar1;
  if (pIVar1 != (Item *)0x0) {
    this_00->nextCell->cell = this_00->cell;
  }
  if (this_00->prev == (Item *)0x0) {
    pIVar1 = this_00->next;
    (this->_begin).item = pIVar1;
    pIVar1->prev = (Item *)0x0;
  }
  else {
    pIVar1 = this_00->prev;
    pIVar2 = this_00->next;
    this_00->prev->next = pIVar2;
    pIVar2->prev = pIVar1;
  }
  this->_size = this->_size - 1;
  Item::~Item(this_00);
  this_00->prev = this->freeItem;
  this->freeItem = this_00;
  Iterator::Iterator((Iterator *)&this_local,this_00->next);
  return (int)this_local;
}

Assistant:

Iterator remove(const Iterator& it)
  {
    Item* item = it.item;

    if((*item->cell = item->nextCell))
      item->nextCell->cell = item->cell;

    if(!item->prev)
      (_begin.item = item->next)->prev = 0;
    else
      (item->prev->next = item->next)->prev = item->prev;

    --_size;

    item->~Item();
    item->prev = freeItem;
    freeItem = item;
    return item->next;
  }